

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-common.cpp
# Opt level: O3

void test_common<float>(uint length,float value)

{
  float fVar1;
  bool bVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  _func_int **pp_Var4;
  _Atomic_word _Var5;
  _Atomic_word _Var6;
  _Atomic_word _Var7;
  _Atomic_word _Var8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var10;
  int iVar11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var13;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var14;
  undefined8 *puVar15;
  uint uVar16;
  uint uVar17;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var18;
  long lVar19;
  ulong uVar20;
  __shared_count<(__gnu_cxx::_Lock_policy)2> __s;
  size_t __size;
  undefined4 in_XMM0_Db;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_70;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  shared_ptr<float> pa;
  shared_ptr<float> pb;
  
  pb.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ = in_XMM0_Db;
  pb.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = value;
  p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ulong)length;
  __size = (long)(int)(length + 1) << 2;
  iVar11 = posix_memalign(&pa.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi,0x10,__size);
  local_68 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (iVar11 == 0) {
    local_68 = pa.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<float*,void(*)(float*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pa,local_68,sse::common::free<float>);
  iVar11 = posix_memalign(&local_70,0x10,__size);
  pa.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (iVar11 == 0) {
    pa.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = local_70;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<float*,void(*)(float*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pb,
             pa.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
             sse::common::free<float>);
  _Var10._M_pi = pa.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  p_Var9 = local_68;
  *(undefined4 *)((long)&local_68->_vptr__Sp_counted_base + (long)p_Var3 * 4) = 0x42fe0000;
  *(undefined4 *)
   ((long)&(pa.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
           _vptr__Sp_counted_base + (long)p_Var3 * 4) = 0x427c0000;
  p_Var12 = local_68;
  p_Var13 = p_Var3;
  uVar16 = length;
  if (0xf < (int)length) {
    do {
      *(float *)&p_Var12->_vptr__Sp_counted_base =
           pb.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_;
      *(float *)((long)&p_Var12->_vptr__Sp_counted_base + 4) =
           pb.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_;
      p_Var12->_M_use_count =
           (_Atomic_word)
           pb.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_;
      p_Var12->_M_weak_count =
           (_Atomic_word)
           pb.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_;
      *(float *)&p_Var12[1]._vptr__Sp_counted_base =
           pb.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_;
      *(float *)((long)&p_Var12[1]._vptr__Sp_counted_base + 4) =
           pb.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_;
      p_Var12[1]._M_use_count =
           (_Atomic_word)
           pb.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_;
      p_Var12[1]._M_weak_count =
           (_Atomic_word)
           pb.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_;
      *(float *)&p_Var12[2]._vptr__Sp_counted_base =
           pb.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_;
      *(float *)((long)&p_Var12[2]._vptr__Sp_counted_base + 4) =
           pb.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_;
      p_Var12[2]._M_use_count =
           (_Atomic_word)
           pb.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_;
      p_Var12[2]._M_weak_count =
           (_Atomic_word)
           pb.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_;
      *(float *)&p_Var12[3]._vptr__Sp_counted_base =
           pb.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_;
      *(float *)((long)&p_Var12[3]._vptr__Sp_counted_base + 4) =
           pb.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_;
      p_Var12[3]._M_use_count =
           (_Atomic_word)
           pb.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_;
      p_Var12[3]._M_weak_count =
           (_Atomic_word)
           pb.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_;
      uVar17 = (uint)p_Var13;
      uVar16 = uVar17 - 0x10;
      p_Var12 = p_Var12 + 4;
      p_Var13 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ulong)uVar16;
    } while (0x1f < uVar17);
  }
  if (7 < (int)uVar16) {
    *(float *)&p_Var12->_vptr__Sp_counted_base =
         pb.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_;
    *(float *)((long)&p_Var12->_vptr__Sp_counted_base + 4) =
         pb.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_;
    p_Var12->_M_use_count =
         (_Atomic_word)
         pb.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_;
    p_Var12->_M_weak_count =
         (_Atomic_word)
         pb.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_;
    *(float *)&p_Var12[1]._vptr__Sp_counted_base =
         pb.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_;
    *(float *)((long)&p_Var12[1]._vptr__Sp_counted_base + 4) =
         pb.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_;
    p_Var12[1]._M_use_count =
         (_Atomic_word)
         pb.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_;
    p_Var12[1]._M_weak_count =
         (_Atomic_word)
         pb.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_;
    uVar16 = uVar16 - 8;
    p_Var12 = p_Var12 + 2;
  }
  if (3 < (int)uVar16) {
    *(float *)&p_Var12->_vptr__Sp_counted_base =
         pb.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_;
    *(float *)((long)&p_Var12->_vptr__Sp_counted_base + 4) =
         pb.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_;
    p_Var12->_M_use_count =
         (_Atomic_word)
         pb.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_;
    p_Var12->_M_weak_count =
         (_Atomic_word)
         pb.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_;
    uVar16 = uVar16 - 4;
    p_Var12 = p_Var12 + 1;
  }
  if (0 < (int)uVar16) {
    uVar16 = uVar16 + 1;
    do {
      *(float *)&p_Var12->_vptr__Sp_counted_base =
           pb.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_;
      p_Var12 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                ((long)&p_Var12->_vptr__Sp_counted_base + 4);
      uVar16 = uVar16 - 1;
    } while (1 < uVar16);
  }
  uVar16 = length;
  if (length == 0) goto LAB_00107770;
  p_Var12 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  do {
    fVar1 = *(float *)((long)&local_68->_vptr__Sp_counted_base + (long)p_Var12 * 4);
    if ((fVar1 != pb.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_)
       || (NAN(fVar1) ||
           NAN(pb.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_))) {
      puVar15 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar15 = "void test_common(unsigned int, T) [T = float]";
      *(undefined4 *)(puVar15 + 1) = 0x16;
      *(uint *)((long)puVar15 + 0xc) = length;
      __cxa_throw(puVar15,&Exception::typeinfo,0);
    }
    p_Var12 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              ((long)&p_Var12->_vptr__Sp_counted_base + 1);
  } while (p_Var3 != p_Var12);
  bVar2 = 7 < (int)length;
  _Var14._M_pi = pa.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  p_Var12 = local_68;
  p_Var13 = p_Var3;
  if ((int)length < 8) {
    bVar2 = false;
  }
  else {
    do {
      _Var5 = p_Var12->_M_use_count;
      _Var6 = p_Var12->_M_weak_count;
      pp_Var4 = p_Var12[1]._vptr__Sp_counted_base;
      _Var7 = p_Var12[1]._M_use_count;
      _Var8 = p_Var12[1]._M_weak_count;
      (_Var14._M_pi)->_vptr__Sp_counted_base = p_Var12->_vptr__Sp_counted_base;
      (_Var14._M_pi)->_M_use_count = _Var5;
      (_Var14._M_pi)->_M_weak_count = _Var6;
      _Var14._M_pi[1]._vptr__Sp_counted_base = pp_Var4;
      _Var14._M_pi[1]._M_use_count = _Var7;
      _Var14._M_pi[1]._M_weak_count = _Var8;
      uVar17 = (uint)p_Var13;
      uVar16 = uVar17 - 8;
      p_Var12 = p_Var12 + 2;
      _Var14._M_pi = _Var14._M_pi + 2;
      p_Var13 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ulong)uVar16;
    } while (0xf < uVar17);
  }
  if (3 < (int)uVar16) {
    _Var5 = p_Var12->_M_use_count;
    _Var6 = p_Var12->_M_weak_count;
    (_Var14._M_pi)->_vptr__Sp_counted_base = p_Var12->_vptr__Sp_counted_base;
    (_Var14._M_pi)->_M_use_count = _Var5;
    (_Var14._M_pi)->_M_weak_count = _Var6;
    uVar16 = uVar16 - 4;
    p_Var12 = p_Var12 + 1;
    _Var14._M_pi = _Var14._M_pi + 1;
  }
  if (0 < (int)uVar16) {
    uVar16 = uVar16 + 1;
    lVar19 = 0;
    do {
      *(undefined4 *)((long)&(_Var14._M_pi)->_vptr__Sp_counted_base + lVar19) =
           *(undefined4 *)((long)&p_Var12->_vptr__Sp_counted_base + lVar19);
      lVar19 = lVar19 + 4;
      uVar16 = uVar16 - 1;
    } while (1 < uVar16);
  }
  _Var18._M_pi = p_Var3;
  _Var14._M_pi = _Var10._M_pi;
  p_Var12 = p_Var9;
  if (length == 0) {
LAB_001076df:
    uVar16 = (uint)_Var18._M_pi;
    if (!bVar2) goto LAB_00107770;
LAB_001076e8:
    uVar16 = (uint)_Var18._M_pi;
    uVar20 = (ulong)_Var18._M_pi & 0xffffffff;
    do {
      _Var5 = p_Var12->_M_use_count;
      _Var6 = p_Var12->_M_weak_count;
      pp_Var4 = p_Var12[1]._vptr__Sp_counted_base;
      _Var7 = p_Var12[1]._M_use_count;
      _Var8 = p_Var12[1]._M_weak_count;
      (_Var14._M_pi)->_vptr__Sp_counted_base = p_Var12->_vptr__Sp_counted_base;
      (_Var14._M_pi)->_M_use_count = _Var5;
      (_Var14._M_pi)->_M_weak_count = _Var6;
      _Var14._M_pi[1]._vptr__Sp_counted_base = pp_Var4;
      _Var14._M_pi[1]._M_use_count = _Var7;
      _Var14._M_pi[1]._M_weak_count = _Var8;
      iVar11 = (int)uVar20;
      uVar17 = iVar11 - 8;
      p_Var12 = p_Var12 + 2;
      _Var14._M_pi = _Var14._M_pi + 2;
      uVar20 = (ulong)uVar17;
    } while (0xf < iVar11);
  }
  else {
    p_Var13 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    do {
      fVar1 = *(float *)((long)&(pa.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi)->_vptr__Sp_counted_base + (long)p_Var13 * 4);
      if ((fVar1 != pb.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_
          ) || (NAN(fVar1) ||
                NAN(pb.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_
                   ))) {
        puVar15 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar15 = "void test_common(unsigned int, T) [T = float]";
        *(undefined4 *)(puVar15 + 1) = 0x1d;
        *(uint *)((long)puVar15 + 0xc) = length;
        __cxa_throw(puVar15,&Exception::typeinfo,0);
      }
      p_Var13 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                ((long)&p_Var13->_vptr__Sp_counted_base + 1);
    } while (p_Var3 != p_Var13);
    p_Var13 = p_Var3;
    __s._M_pi = pa.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (0xf < (int)length) {
      iVar11 = length - 0x1f;
      if (length < 0x1f) {
        iVar11 = 0;
      }
      uVar20 = (ulong)(iVar11 + 0xfU >> 4);
      pb.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var3;
      memset(pa.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,0,
             uVar20 * 0x40 + 0x40);
      p_Var13 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                (ulong)(((int)pb.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                              _M_pi - (iVar11 + 0xfU & 0x7ffffff0)) - 0x10);
      __s._M_pi = _Var10._M_pi + uVar20 * 4 + 4;
      _Var18._M_pi = pb.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    }
    uVar16 = (uint)_Var18._M_pi;
    if (7 < (int)p_Var13) {
      p_Var13 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ulong)((int)p_Var13 - 8);
      __s._M_pi[1]._vptr__Sp_counted_base = (_func_int **)0x0;
      __s._M_pi[1]._M_use_count = 0;
      __s._M_pi[1]._M_weak_count = 0;
      (__s._M_pi)->_vptr__Sp_counted_base = (_func_int **)0x0;
      (__s._M_pi)->_M_use_count = 0;
      (__s._M_pi)->_M_weak_count = 0;
      __s._M_pi = __s._M_pi + 2;
    }
    if (3 < (int)p_Var13) {
      (__s._M_pi)->_vptr__Sp_counted_base = (_func_int **)0x0;
      (__s._M_pi)->_M_use_count = 0;
      (__s._M_pi)->_M_weak_count = 0;
      p_Var13 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ulong)((int)p_Var13 - 4);
      __s._M_pi = __s._M_pi + 1;
    }
    if (0 < (int)p_Var13) {
      memset(__s._M_pi,0,(long)p_Var13 << 2);
    }
    if (uVar16 == 0) goto LAB_001076df;
    p_Var13 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    do {
      fVar1 = *(float *)((long)&(_Var10._M_pi)->_vptr__Sp_counted_base + (long)p_Var13 * 4);
      if ((fVar1 != 0.0) || (NAN(fVar1))) {
        puVar15 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar15 = "void test_common(unsigned int, T) [T = float]";
        *(undefined4 *)(puVar15 + 1) = 0x24;
        *(uint *)((long)puVar15 + 0xc) = uVar16;
        __cxa_throw(puVar15,&Exception::typeinfo,0);
      }
      p_Var13 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                ((long)&p_Var13->_vptr__Sp_counted_base + 1);
    } while (p_Var3 != p_Var13);
    if (uVar16 != 0) {
      p_Var13 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      do {
        *(float *)((long)&p_Var9->_vptr__Sp_counted_base + (long)p_Var13 * 4) =
             (float)((ulong)p_Var13 & 0xffffffff);
        p_Var13 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  ((long)&p_Var13->_vptr__Sp_counted_base + 1);
      } while (p_Var3 != p_Var13);
    }
    uVar17 = uVar16;
    if (bVar2) goto LAB_001076e8;
  }
  if (3 < (int)uVar17) {
    _Var5 = p_Var12->_M_use_count;
    _Var6 = p_Var12->_M_weak_count;
    (_Var14._M_pi)->_vptr__Sp_counted_base = p_Var12->_vptr__Sp_counted_base;
    (_Var14._M_pi)->_M_use_count = _Var5;
    (_Var14._M_pi)->_M_weak_count = _Var6;
    uVar17 = uVar17 - 4;
    p_Var12 = p_Var12 + 1;
    _Var14._M_pi = _Var14._M_pi + 1;
  }
  if (0 < (int)uVar17) {
    uVar17 = uVar17 + 1;
    lVar19 = 0;
    do {
      *(undefined4 *)((long)&(_Var14._M_pi)->_vptr__Sp_counted_base + lVar19) =
           *(undefined4 *)((long)&p_Var12->_vptr__Sp_counted_base + lVar19);
      lVar19 = lVar19 + 4;
      uVar17 = uVar17 - 1;
    } while (1 < uVar17);
  }
  if (uVar16 != 0) {
    p_Var12 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    do {
      fVar1 = *(float *)((long)&(_Var10._M_pi)->_vptr__Sp_counted_base + (long)p_Var12 * 4);
      if ((fVar1 != (float)((ulong)p_Var12 & 0xffffffff)) ||
         (NAN(fVar1) || NAN((float)((ulong)p_Var12 & 0xffffffff)))) {
        puVar15 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar15 = "void test_common(unsigned int, T) [T = float]";
        *(undefined4 *)(puVar15 + 1) = 0x2d;
        *(uint *)((long)puVar15 + 0xc) = length;
        __cxa_throw(puVar15,&Exception::typeinfo,0);
      }
      p_Var12 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                ((long)&p_Var12->_vptr__Sp_counted_base + 1);
    } while (p_Var3 != p_Var12);
  }
LAB_00107770:
  fVar1 = *(float *)((long)&p_Var9->_vptr__Sp_counted_base + (long)p_Var3 * 4);
  if ((((fVar1 == 127.0) && (!NAN(fVar1))) &&
      (fVar1 = *(float *)((long)&(_Var10._M_pi)->_vptr__Sp_counted_base + (long)p_Var3 * 4),
      fVar1 == 63.0)) && (!NAN(fVar1))) {
    if (pb.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 pb.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
    if (pa.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 pa.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
    return;
  }
  puVar15 = (undefined8 *)__cxa_allocate_exception(0x10);
  *puVar15 = "void test_common(unsigned int, T) [T = float]";
  *(undefined4 *)(puVar15 + 1) = 0x31;
  *(uint *)((long)puVar15 + 0xc) = uVar16;
  __cxa_throw(puVar15,&Exception::typeinfo,0);
}

Assistant:

void test_common(unsigned length, T value = 42)
{
    std::shared_ptr<T> pa = std::shared_ptr<T>(simd::malloc<T>(length+1), simd::free<T>);
    std::shared_ptr<T> pb = std::shared_ptr<T>(simd::malloc<T>(length+1), simd::free<T>);
    T * a = pa.get();
    T * b = pb.get();
    a[length] = 0x7f;
    b[length] = 0x3f;

    simd::set(value, a, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (a[i] != value)
            FAIL();
    }

    simd::copy(a, b, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (b[i] != value)
            FAIL();
    }

    simd::zero(b, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (b[i] != 0)
            FAIL();
    }

    for (unsigned i=0; i<length; ++i)
        a[i] = i;
    simd::copy(a, b, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (b[i] != (T)i)
            FAIL();
    }

    if (a[length] != 0x7f || b[length] != 0x3f)
        FAIL();
}